

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::WriteBlockToDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  long lVar1;
  size_t sVar2;
  int64_t iVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  ParamsWrapper<TransactionSerParams,_const_CBlock> local_78;
  AutoFile fileout;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  OpenBlockFile(&fileout,this,pos,false);
  if (fileout.m_file == (FILE *)0x0) {
    logging_function._M_str = "WriteBlockToDisk";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x65;
    LogPrintFormatInternal<char[17]>
              (logging_function,source_file,0x3cb,ALL,Error,(ConstevalFormatString<1U>)0x68d5bc,
               (char (*) [17])"WriteBlockToDisk");
  }
  else {
    local_78.m_params = &::TX_WITH_WITNESS;
    local_78.m_object = block;
    sVar2 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>(&local_78);
    Serialize<AutoFile,_unsigned_char,_4UL>(&fileout,&((this->m_opts).chainparams)->pchMessageStart)
    ;
    ser_writedata32<AutoFile>(&fileout,(uint32_t)sVar2);
    iVar3 = AutoFile::tell(&fileout);
    pos->nPos = (uint)iVar3;
    local_78.m_params = &::TX_WITH_WITNESS;
    local_78.m_object = block;
    ParamsWrapper<TransactionSerParams,_const_CBlock>::Serialize<AutoFile>(&local_78,&fileout);
  }
  AutoFile::~AutoFile(&fileout);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return fileout.m_file != (FILE *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteBlockToDisk(const CBlock& block, FlatFilePos& pos) const
{
    // Open history file to append
    AutoFile fileout{OpenBlockFile(pos)};
    if (fileout.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }

    // Write index header
    unsigned int nSize = GetSerializeSize(TX_WITH_WITNESS(block));
    fileout << GetParams().MessageStart() << nSize;

    // Write block
    long fileOutPos = fileout.tell();
    pos.nPos = (unsigned int)fileOutPos;
    fileout << TX_WITH_WITNESS(block);

    return true;
}